

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void setup_loop_pressure(gen_ctx_t gen_ctx,loop_node_t_conflict loop_node)

{
  int iVar1;
  gen_ctx_t gen_ctx_00;
  bitmap_t pVVar2;
  VARR_void_ptr_t **ppVVar3;
  
  ppVVar3 = &gen_ctx->to_free;
  while (gen_ctx_00 = (gen_ctx_t)*ppVVar3, gen_ctx_00 != (gen_ctx_t)0x0) {
    if (*(long *)&gen_ctx_00->optimize_level == 0) {
      setup_loop_pressure(gen_ctx_00,loop_node);
      pVVar2 = (bitmap_t)(ulong)*(uint *)&gen_ctx_00->insn_to_consider;
    }
    else {
      pVVar2 = *(bitmap_t *)(*(long *)&gen_ctx_00->optimize_level + 0xa0);
      gen_ctx_00->insn_to_consider = pVVar2;
    }
    if (*(int *)&gen_ctx->insn_to_consider < (int)pVVar2) {
      *(int *)&gen_ctx->insn_to_consider = (int)pVVar2;
    }
    iVar1 = *(int *)((long)&gen_ctx_00->insn_to_consider + 4);
    if (*(int *)((long)&gen_ctx->insn_to_consider + 4) < iVar1) {
      *(int *)((long)&gen_ctx->insn_to_consider + 4) = iVar1;
    }
    ppVVar3 = (VARR_void_ptr_t **)&gen_ctx_00->addr_regs;
  }
  return;
}

Assistant:

static void setup_loop_pressure (gen_ctx_t gen_ctx, loop_node_t loop_node) {
  for (loop_node_t curr = DLIST_HEAD (loop_node_t, loop_node->children); curr != NULL;
       curr = DLIST_NEXT (loop_node_t, curr)) {
    if (curr->bb == NULL) {
      setup_loop_pressure (gen_ctx, curr);
    } else {
      curr->max_int_pressure = curr->bb->max_int_pressure;
      curr->max_fp_pressure = curr->bb->max_fp_pressure;
    }
    if (loop_node->max_int_pressure < curr->max_int_pressure)
      loop_node->max_int_pressure = curr->max_int_pressure;
    if (loop_node->max_fp_pressure < curr->max_fp_pressure)
      loop_node->max_fp_pressure = curr->max_fp_pressure;
  }
}